

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

double trng::math::detail::GammaP_ser<double,false>(double a,double x)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = 0.0;
  if (8.881784197001252e-16 <= x) {
    dVar4 = 1.0 / a;
    dVar5 = a;
    dVar3 = dVar4;
    uVar1 = 0;
    do {
      dVar5 = dVar5 + 1.0;
      dVar4 = (x / dVar5) * dVar4;
      dVar3 = dVar3 + dVar4;
      if (ABS(dVar4) <= ABS(dVar3) * 8.881784197001252e-16) break;
      bVar2 = uVar1 < 0x34;
      uVar1 = uVar1 + 1;
    } while (bVar2);
    dVar5 = log(x);
    dVar5 = exp(dVar5 * a - x);
    dVar3 = dVar3 * dVar5;
  }
  return dVar3;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_ser(T a, T x) {
        const int itmax{numeric_limits<T>::digits};
        const T eps{4 * numeric_limits<T>::epsilon()};
        if (x < eps)
          return T{0};
        T xx{1 / a}, n{a}, sum{xx};
        int i{0};
        do {
          ++n;
          ++i;
          xx *= x / n;
          sum += xx;
        } while (abs(xx) > eps * abs(sum) and i < itmax);
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a)
#else
        if (by_Gamma_a)
#endif
          return exp(-x + a * ln(x) - ln_Gamma(a)) * sum;
        else
          return exp(-x + a * ln(x)) * sum;
      }